

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ExpressionStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,ExpressionSyntax *args_2,
          Token *args_3)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  ExpressionStatementSyntax *this_00;
  
  this_00 = (ExpressionStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExpressionStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ExpressionStatementSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar2 = args_3->kind;
  uVar3 = args_3->field_0x2;
  NVar4.raw = (args_3->numFlags).raw;
  uVar5 = args_3->rawLen;
  pIVar1 = args_3->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,ExpressionStatement,*args,args_1);
  (this_00->expr).ptr = args_2;
  (this_00->semi).kind = TVar2;
  (this_00->semi).field_0x2 = uVar3;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar4.raw;
  (this_00->semi).rawLen = uVar5;
  (this_00->semi).info = pIVar1;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }